

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

void __thiscall PatternBlock::restoreXml(PatternBlock *this,Element *el)

{
  uint *puVar1;
  Element *this_00;
  string *psVar2;
  pointer ppEVar3;
  allocator local_1fd;
  uintm mask;
  string local_1f8;
  PatternBlock *local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1c8;
  Element *local_1c0;
  uintm val;
  istringstream s;
  uint auStack_198 [90];
  
  std::__cxx11::string::string((string *)&local_1f8,"offset",(allocator *)&mask);
  psVar2 = Element::getAttributeValue(el,&local_1f8);
  std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)psVar2,_S_in);
  std::__cxx11::string::~string((string *)&local_1f8);
  puVar1 = (uint *)((long)auStack_198 + *(long *)(_s + -0x18));
  *puVar1 = *puVar1 & 0xffffffb5;
  std::istream::operator>>(&s,&this->offset);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s);
  std::__cxx11::string::string((string *)&local_1f8,"nonzero",(allocator *)&mask);
  psVar2 = Element::getAttributeValue(el,&local_1f8);
  std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)psVar2,_S_in);
  std::__cxx11::string::~string((string *)&local_1f8);
  puVar1 = (uint *)((long)auStack_198 + *(long *)(_s + -0x18));
  *puVar1 = *puVar1 & 0xffffffb5;
  std::istream::operator>>(&s,&this->nonzerosize);
  std::__cxx11::istringstream::~istringstream((istringstream *)&s);
  local_1c8 = &this->maskvec;
  local_1d0 = &this->valvec;
  local_1d8 = this;
  local_1c0 = el;
  for (ppEVar3 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar3 !=
      (local_1c0->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar3 = ppEVar3 + 1) {
    this_00 = *ppEVar3;
    std::__cxx11::string::string((string *)&local_1f8,"mask",&local_1fd);
    psVar2 = Element::getAttributeValue(this_00,&local_1f8);
    std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)psVar2,_S_in);
    std::__cxx11::string::~string((string *)&local_1f8);
    puVar1 = (uint *)((long)auStack_198 + *(long *)(_s + -0x18));
    *puVar1 = *puVar1 & 0xffffffb5;
    std::istream::_M_extract<unsigned_int>((uint *)&s);
    std::__cxx11::istringstream::~istringstream((istringstream *)&s);
    std::__cxx11::string::string((string *)&local_1f8,"val",&local_1fd);
    psVar2 = Element::getAttributeValue(this_00,&local_1f8);
    std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)psVar2,_S_in);
    std::__cxx11::string::~string((string *)&local_1f8);
    puVar1 = (uint *)((long)auStack_198 + *(long *)(_s + -0x18));
    *puVar1 = *puVar1 & 0xffffffb5;
    std::istream::_M_extract<unsigned_int>((uint *)&s);
    std::__cxx11::istringstream::~istringstream((istringstream *)&s);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_1c8,&mask);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_1d0,&val);
  }
  normalize(local_1d8);
  return;
}

Assistant:

void PatternBlock::restoreXml(const Element *el)

{
  {
    istringstream s(el->getAttributeValue("offset"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> offset;
  }
  {
    istringstream s(el->getAttributeValue("nonzero"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    s >> nonzerosize;
  }
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  uintm mask,val;
  while(iter != list.end()) {
    Element *subel = *iter;
    {
      istringstream s(subel->getAttributeValue("mask"));
      s.unsetf(ios::dec | ios::hex | ios::oct);
      s >> mask;
    }
    {
      istringstream s(subel->getAttributeValue("val"));
      s.unsetf(ios::dec | ios::hex | ios::oct);
      s >> val;
    }
    maskvec.push_back(mask);
    valvec.push_back(val);
    ++iter;
  }
  normalize();
}